

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_bf_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte local_7d;
  CTypeID did;
  uint uStack_78;
  uint8_t tmpbool;
  uint32_t mask;
  uint32_t val;
  CTSize bsz;
  CTSize pos;
  CTInfo info;
  TValue *o_local;
  uint8_t *dp_local;
  CType *d_local;
  CTState *cts_local;
  CTState *local_40;
  undefined4 local_34;
  CTState *local_30;
  undefined4 local_24;
  CTState *local_20;
  uint local_14;
  CTState *local_10;
  
  bsz = d->info;
  _pos = o;
  o_local = (TValue *)dp;
  dp_local = (uint8_t *)d;
  d_local = (CType *)cts;
  if ((bsz & 0x8000000) == 0) {
    cts_local._4_4_ = 9;
    if ((bsz & 0x800000) != 0) {
      cts_local._4_4_ = 10;
    }
    local_40 = cts;
    local_14 = cts_local._4_4_;
    local_10 = cts;
    lj_cconv_ct_tv(cts,cts->tab + cts_local._4_4_,(uint8_t *)&stack0xffffffffffffff88,o,0);
  }
  else {
    local_34 = 3;
    local_24 = 3;
    local_30 = cts;
    local_20 = cts;
    lj_cconv_ct_tv(cts,cts->tab + 3,&local_7d,o,0);
    uStack_78 = (uint)local_7d;
  }
  val = bsz & 0x7f;
  mask = bsz >> 8 & 0x7f;
  if ((bsz >> 0x10 & 0x7f) << 3 < val + mask) {
    lj_err_caller((lua_State *)(d_local->name).gcptr64,LJ_ERR_FFI_NYIPACKBIT);
  }
  uVar1 = (1 << ((byte)mask & 0x1f)) + -1 << ((byte)val & 0x1f);
  uVar2 = uStack_78 << ((byte)val & 0x1f) & uVar1;
  uVar3 = bsz >> 0x10 & 0x7f;
  if (uVar3 == 1) {
    *(byte *)o_local = *(byte *)o_local & ((byte)uVar1 ^ 0xff) | (byte)uVar2;
  }
  else if (uVar3 == 2) {
    *(ushort *)o_local = *(ushort *)o_local & ((ushort)uVar1 ^ 0xffff) | (ushort)uVar2;
  }
  else if (uVar3 == 4) {
    (o_local->u32).lo = (o_local->u32).lo & (uVar1 ^ 0xffffffff) | uVar2;
  }
  return;
}

Assistant:

void lj_cconv_bf_tv(CTState *cts, CType *d, uint8_t *dp, TValue *o)
{
  CTInfo info = d->info;
  CTSize pos, bsz;
  uint32_t val, mask;
  lj_assertCTS(ctype_isbitfield(info), "bitfield expected");
  if ((info & CTF_BOOL)) {
    uint8_t tmpbool;
    lj_assertCTS(ctype_bitbsz(info) == 1, "bad bool bitfield size");
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_BOOL), &tmpbool, o, 0);
    val = tmpbool;
  } else {
    CTypeID did = (info & CTF_UNSIGNED) ? CTID_UINT32 : CTID_INT32;
    lj_cconv_ct_tv(cts, ctype_get(cts, did), (uint8_t *)&val, o, 0);
  }
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lj_assertCTS(pos < 8*ctype_bitcsz(info), "bad bitfield position");
  lj_assertCTS(bsz > 0 && bsz <= 8*ctype_bitcsz(info), "bad bitfield size");
  /* Check if a packed bitfield crosses a container boundary. */
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  mask = ((1u << bsz) - 1u) << pos;
  val = (val << pos) & mask;
  /* NYI: packed bitfields may cause misaligned reads/writes. */
  switch (ctype_bitcsz(info)) {
  case 4: *(uint32_t *)dp = (*(uint32_t *)dp & ~mask) | (uint32_t)val; break;
  case 2: *(uint16_t *)dp = (*(uint16_t *)dp & ~mask) | (uint16_t)val; break;
  case 1: *(uint8_t *)dp = (*(uint8_t *)dp & ~mask) | (uint8_t)val; break;
  default:
    lj_assertCTS(0, "bad bitfield container size %d", ctype_bitcsz(info));
    break;
  }
}